

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter.cpp
# Opt level: O0

bool __thiscall
jsonnet::internal::FixNewlines::shouldExpand(FixNewlines *this,ArrayComprehension *comp)

{
  bool bVar1;
  int iVar2;
  iterator __lhs;
  long in_RSI;
  Fodder *in_RDI;
  ComprehensionSpec *spec;
  iterator __end2;
  iterator __begin2;
  vector<jsonnet::internal::ComprehensionSpec,_std::allocator<jsonnet::internal::ComprehensionSpec>_>
  *__range2;
  reference in_stack_ffffffffffffffc8;
  __normal_iterator<jsonnet::internal::ComprehensionSpec_*,_std::vector<jsonnet::internal::ComprehensionSpec,_std::allocator<jsonnet::internal::ComprehensionSpec>_>_>
  local_28;
  long local_20;
  long local_18;
  bool local_1;
  
  local_18 = in_RSI;
  internal::open_fodder((AST *)0x2438df);
  iVar2 = countNewlines(in_RDI);
  if (iVar2 < 1) {
    local_20 = local_18 + 0xa8;
    local_28._M_current =
         (ComprehensionSpec *)
         std::
         vector<jsonnet::internal::ComprehensionSpec,_std::allocator<jsonnet::internal::ComprehensionSpec>_>
         ::begin((vector<jsonnet::internal::ComprehensionSpec,_std::allocator<jsonnet::internal::ComprehensionSpec>_>
                  *)in_stack_ffffffffffffffc8);
    __lhs = std::
            vector<jsonnet::internal::ComprehensionSpec,_std::allocator<jsonnet::internal::ComprehensionSpec>_>
            ::end((vector<jsonnet::internal::ComprehensionSpec,_std::allocator<jsonnet::internal::ComprehensionSpec>_>
                   *)in_stack_ffffffffffffffc8);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<jsonnet::internal::ComprehensionSpec_*,_std::vector<jsonnet::internal::ComprehensionSpec,_std::allocator<jsonnet::internal::ComprehensionSpec>_>_>
                               *)__lhs._M_current,
                              (__normal_iterator<jsonnet::internal::ComprehensionSpec_*,_std::vector<jsonnet::internal::ComprehensionSpec,_std::allocator<jsonnet::internal::ComprehensionSpec>_>_>
                               *)in_stack_ffffffffffffffc8), bVar1) {
      in_stack_ffffffffffffffc8 =
           __gnu_cxx::
           __normal_iterator<jsonnet::internal::ComprehensionSpec_*,_std::vector<jsonnet::internal::ComprehensionSpec,_std::allocator<jsonnet::internal::ComprehensionSpec>_>_>
           ::operator*(&local_28);
      iVar2 = countNewlines(in_RDI);
      if (0 < iVar2) {
        return true;
      }
      __gnu_cxx::
      __normal_iterator<jsonnet::internal::ComprehensionSpec_*,_std::vector<jsonnet::internal::ComprehensionSpec,_std::allocator<jsonnet::internal::ComprehensionSpec>_>_>
      ::operator++(&local_28);
    }
    iVar2 = countNewlines(in_RDI);
    if (iVar2 < 1) {
      local_1 = false;
    }
    else {
      local_1 = true;
    }
  }
  else {
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool shouldExpand(ArrayComprehension *comp)
    {
        if (countNewlines(open_fodder(comp->body)) > 0) {
            return true;
        }
        for (auto &spec : comp->specs) {
            if (countNewlines(spec.openFodder) > 0) {
                return true;
            }
        }
        if (countNewlines(comp->closeFodder) > 0) {
            return true;
        }
        return false;
    }